

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCover.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverDup(Mvc_Cover_t *p)

{
  int *piVar1;
  Mvc_Cover_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube;
  
  pMVar2 = Mvc_CoverClone(p);
  pCube = (Mvc_Cube_t *)&p->lCubes;
  while (pCube = pCube->pNext, pCube != (Mvc_Cube_t *)0x0) {
    pMVar3 = Mvc_CubeDup(p,pCube);
    pMVar4 = (Mvc_Cube_t *)&pMVar2->lCubes;
    if ((pMVar2->lCubes).pHead != (Mvc_Cube_t *)0x0) {
      pMVar4 = (pMVar2->lCubes).pTail;
    }
    pMVar4->pNext = pMVar3;
    (pMVar2->lCubes).pTail = pMVar3;
    pMVar3->pNext = (Mvc_Cube_t *)0x0;
    piVar1 = &(pMVar2->lCubes).nItems;
    *piVar1 = *piVar1 + 1;
  }
  return pMVar2;
}

Assistant:

Mvc_Cover_t * Mvc_CoverDup( Mvc_Cover_t * p )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeDup( p, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    return pCover;
}